

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPService.cpp
# Opt level: O1

AddSocketOptionFunc *
brynet::net::TcpService::AddSocketOption::WithDataCallback
          (AddSocketOptionFunc *__return_storage_ptr__,DATA_CALLBACK *callback)

{
  undefined8 *puVar1;
  _Any_data local_28;
  code *local_18;
  undefined8 uStack_10;
  
  std::function<unsigned_long_(long,_const_char_*,_unsigned_long)>::function
            ((function<unsigned_long_(long,_const_char_*,_unsigned_long)> *)&local_28,callback);
  (__return_storage_ptr__->super__Function_base)._M_manager = (_Manager_type)0x0;
  __return_storage_ptr__->_M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(__return_storage_ptr__->super__Function_base)._M_functor = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->super__Function_base)._M_functor + 8) = 0;
  puVar1 = (undefined8 *)operator_new(0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  puVar1[3] = uStack_10;
  if (local_18 != (code *)0x0) {
    *puVar1 = local_28._M_unused._M_object;
    puVar1[1] = local_28._8_8_;
    puVar1[2] = local_18;
    local_18 = (code *)0x0;
    uStack_10 = 0;
  }
  *(undefined8 **)&(__return_storage_ptr__->super__Function_base)._M_functor = puVar1;
  __return_storage_ptr__->_M_invoker =
       std::
       _Function_handler<void_(brynet::net::TcpService::AddSocketOption::Options_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:590:12)>
       ::_M_invoke;
  (__return_storage_ptr__->super__Function_base)._M_manager =
       std::
       _Function_handler<void_(brynet::net::TcpService::AddSocketOption::Options_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/dyu[P]brynet/src/brynet/net/TCPService.cpp:590:12)>
       ::_M_manager;
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return __return_storage_ptr__;
}

Assistant:

TcpService::AddSocketOption::AddSocketOptionFunc TcpService::AddSocketOption::WithDataCallback(TcpService::DATA_CALLBACK callback)
{
    return [=](TcpService::AddSocketOption::Options& option) {
        option.dataCallback = callback;
    };
}